

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t assertion_equal_int(char *file,wchar_t line,longlong v1,char *e1,longlong v2,char *e2,
                           void *extra)

{
  char *e2_local;
  longlong v2_local;
  char *e1_local;
  longlong v1_local;
  wchar_t line_local;
  char *file_local;
  
  assertion_count(file,line);
  if (v1 != v2) {
    failure_start(file,line,"%s != %s",e1,e2);
    logprintf("      %s=%lld (0x%llx, 0%llo)\n",e1,v1,v1,v1);
    logprintf("      %s=%lld (0x%llx, 0%llo)\n",e2,v2,v2,v2);
    failure_finish(extra);
  }
  file_local._4_4_ = (wchar_t)(v1 == v2);
  return file_local._4_4_;
}

Assistant:

int
assertion_equal_int(const char *file, int line,
    long long v1, const char *e1, long long v2, const char *e2, void *extra)
{
	assertion_count(file, line);
	if (v1 == v2)
		return (1);
	failure_start(file, line, "%s != %s", e1, e2);
	logprintf("      %s=%lld (0x%llx, 0%llo)\n", e1, v1,
	    (unsigned long long)v1, (unsigned long long)v1);
	logprintf("      %s=%lld (0x%llx, 0%llo)\n", e2, v2,
	    (unsigned long long)v2, (unsigned long long)v2);
	failure_finish(extra);
	return (0);
}